

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool Datetime::valid(int y,int d)

{
  int iVar1;
  int d_local;
  int y_local;
  
  if (((-1 < y) && (0 < d)) && (iVar1 = daysInYear(y), d <= iVar1)) {
    return true;
  }
  return false;
}

Assistant:

bool Datetime::valid (const int y, const int d)
{
  // Check that the year is valid.
  if (y < 0)
    return false;

  if (d < 1 || d > Datetime::daysInYear (y))
    return false;

  return true;
}